

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.c
# Opt level: O0

PTree * p_tree_new_full(PTreeType type,PCompareDataFunc func,ppointer data,PDestroyFunc key_destroy,
                       PDestroyFunc value_destroy)

{
  bool local_41;
  PTree *ret;
  PDestroyFunc value_destroy_local;
  PDestroyFunc key_destroy_local;
  ppointer data_local;
  PCompareDataFunc func_local;
  PTree *pPStack_10;
  PTreeType type_local;
  
  local_41 = type < (P_TREE_TYPE_AVL|P_TREE_TYPE_RB);
  if (local_41) {
    if (func == (PCompareDataFunc)0x0) {
      pPStack_10 = (PTree *)0x0;
    }
    else {
      pPStack_10 = (PTree *)p_malloc0(0x48);
      if (pPStack_10 == (PTree *)0x0) {
        printf("** Error: %s **\n","PTree::p_tree_new_full: failed to allocate memory");
        pPStack_10 = (PTree *)0x0;
      }
      else {
        pPStack_10->type = type;
        pPStack_10->compare_func = func;
        pPStack_10->data = data;
        pPStack_10->key_destroy_func = key_destroy;
        pPStack_10->value_destroy_func = value_destroy;
        if (type == P_TREE_TYPE_BINARY) {
          pPStack_10->insert_node_func = p_tree_bst_insert;
          pPStack_10->remove_node_func = p_tree_bst_remove;
          pPStack_10->free_node_func = p_tree_bst_node_free;
        }
        else if (type == P_TREE_TYPE_RB) {
          pPStack_10->insert_node_func = p_tree_rb_insert;
          pPStack_10->remove_node_func = p_tree_rb_remove;
          pPStack_10->free_node_func = p_tree_rb_node_free;
        }
        else if (type == P_TREE_TYPE_AVL) {
          pPStack_10->insert_node_func = p_tree_avl_insert;
          pPStack_10->remove_node_func = p_tree_avl_remove;
          pPStack_10->free_node_func = p_tree_avl_node_free;
        }
      }
    }
  }
  else {
    pPStack_10 = (PTree *)0x0;
  }
  return pPStack_10;
}

Assistant:

P_LIB_API PTree *
p_tree_new_full (PTreeType		type,
		 PCompareDataFunc	func,
		 ppointer		data,
		 PDestroyFunc		key_destroy,
		 PDestroyFunc		value_destroy)
{
	PTree *ret;

	if (P_UNLIKELY (!((int) type >= (int) P_TREE_TYPE_BINARY &&
			  (int) type <= (int) P_TREE_TYPE_AVL)))
		return NULL;

	if (P_UNLIKELY (func == NULL))
		return NULL;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PTree))) == NULL)) {
		P_ERROR ("PTree::p_tree_new_full: failed to allocate memory");
		return NULL;
	}

	ret->type               = type;
	ret->compare_func       = func;
	ret->data               = data;
	ret->key_destroy_func   = key_destroy;
	ret->value_destroy_func	= value_destroy;

	switch (type) {
	case P_TREE_TYPE_BINARY:
		ret->insert_node_func = p_tree_bst_insert;
		ret->remove_node_func = p_tree_bst_remove;
		ret->free_node_func   = p_tree_bst_node_free;
		break;
	case P_TREE_TYPE_RB:
		ret->insert_node_func = p_tree_rb_insert;
		ret->remove_node_func = p_tree_rb_remove;
		ret->free_node_func   = p_tree_rb_node_free;
		break;
	case P_TREE_TYPE_AVL:
		ret->insert_node_func = p_tree_avl_insert;
		ret->remove_node_func = p_tree_avl_remove;
		ret->free_node_func   = p_tree_avl_node_free;
		break;
	}

	return ret;
}